

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

UBool __thiscall icu_63::Formattable::operator==(Formattable *this,Formattable *that)

{
  UBool UVar1;
  UBool local_25;
  int local_24;
  UBool equal;
  int32_t i;
  Formattable *that_local;
  Formattable *this_local;
  
  if (this == that) {
    this_local._7_1_ = '\x01';
  }
  else if (this->fType == that->fType) {
    local_25 = '\x01';
    switch(this->fType) {
    case kDate:
      local_25 = (this->fValue).fDouble == (that->fValue).fDouble;
      break;
    case kDouble:
      local_25 = (this->fValue).fDouble == (that->fValue).fDouble;
      break;
    case kLong:
    case kInt64:
      local_25 = (this->fValue).fObject == (that->fValue).fObject;
      break;
    case kString:
      local_25 = UnicodeString::operator==((this->fValue).fString,(that->fValue).fString);
      break;
    case kArray:
      if ((this->fValue).fArrayAndCount.fCount == (that->fValue).fArrayAndCount.fCount) {
        for (local_24 = 0; local_24 < (this->fValue).fArrayAndCount.fCount; local_24 = local_24 + 1)
        {
          UVar1 = operator!=((Formattable *)((this->fValue).fObject + (long)local_24 * 0xe),
                             (Formattable *)((that->fValue).fObject + (long)local_24 * 0xe));
          if (UVar1 != '\0') {
            local_25 = '\0';
            break;
          }
        }
      }
      else {
        local_25 = '\0';
      }
      break;
    case kObject:
      if (((this->fValue).fObject == (UObject *)0x0) || ((that->fValue).fObject == (UObject *)0x0))
      {
        local_25 = '\0';
      }
      else {
        local_25 = objectEquals((this->fValue).fObject,(that->fValue).fObject);
      }
    }
    this_local._7_1_ = local_25;
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
Formattable::operator==(const Formattable& that) const
{
    int32_t i;

    if (this == &that) return TRUE;

    // Returns FALSE if the data types are different.
    if (fType != that.fType) return FALSE;

    // Compares the actual data values.
    UBool equal = TRUE;
    switch (fType) {
    case kDate:
        equal = (fValue.fDate == that.fValue.fDate);
        break;
    case kDouble:
        equal = (fValue.fDouble == that.fValue.fDouble);
        break;
    case kLong:
    case kInt64:
        equal = (fValue.fInt64 == that.fValue.fInt64);
        break;
    case kString:
        equal = (*(fValue.fString) == *(that.fValue.fString));
        break;
    case kArray:
        if (fValue.fArrayAndCount.fCount != that.fValue.fArrayAndCount.fCount) {
            equal = FALSE;
            break;
        }
        // Checks each element for equality.
        for (i=0; i<fValue.fArrayAndCount.fCount; ++i) {
            if (fValue.fArrayAndCount.fArray[i] != that.fValue.fArrayAndCount.fArray[i]) {
                equal = FALSE;
                break;
            }
        }
        break;
    case kObject:
        if (fValue.fObject == NULL || that.fValue.fObject == NULL) {
            equal = FALSE;
        } else {
            equal = objectEquals(fValue.fObject, that.fValue.fObject);
        }
        break;
    }

    // TODO:  compare digit lists if numeric.
    return equal;
}